

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::MessageLite,google::protobuf::internal::InternalMetadataWithArenaLite>
          (ExtensionSet *this,char *ptr,MessageLite *containing_type,
          InternalMetadataWithArenaLite *metadata,ParseContext *ctx)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  StringPiece flat;
  _Alloc_hider _Var5;
  size_type sVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  undefined4 extraout_var;
  uint uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  long lVar13;
  uint uVar14;
  undefined8 extraout_RDX;
  ParseContext *p;
  ushort *puVar15;
  ExtensionInfo *extension_00;
  ParseContext *unaff_R12;
  ParseContext *pPVar16;
  uint field_number;
  bool bVar17;
  pair<const_char_*,_int> pVar18;
  pair<const_char_*,_unsigned_int> pVar19;
  pair<const_char_*,_bool> pVar20;
  StringPiece val;
  bool was_packed_on_wire;
  string payload;
  ExtensionInfo extension;
  ParseContext *local_108;
  bool local_f9;
  ParseContext *local_f8;
  InternalMetadataWithArenaLite *local_f0;
  MessageLite *local_e8;
  string local_e0;
  ExtensionInfo local_c0;
  EpsCopyInputStream local_a0;
  int local_48;
  undefined4 local_44;
  DescriptorPool *local_40;
  MessageFactory *pMStack_38;
  
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  field_number = 0;
  local_f8 = (ParseContext *)this;
  local_f0 = metadata;
  local_e8 = containing_type;
  do {
    if (ptr < (ParseContext *)(ctx->super_EpsCopyInputStream).limit_end_) {
      pVar20._8_8_ = 0;
      pVar20.first = ptr;
    }
    else {
      pVar20._8_8_ = 1;
      pVar20.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        this = (ExtensionSet *)ctx;
        pVar20 = EpsCopyInputStream::DoneFallback
                           (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    p = (ParseContext *)pVar20.first;
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) break;
    ptr = (char *)((long)&(p->super_EpsCopyInputStream).limit_end_ + 1);
    cVar1 = *(char *)&(p->super_EpsCopyInputStream).limit_end_;
    if (cVar1 == '\x1a') {
      if (field_number == 0) {
        bVar2 = *(byte *)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_;
        if ((char)bVar2 < '\0') {
          pVar18 = ReadSizeFallback(ptr,(uint)bVar2);
          this = (ExtensionSet *)ptr;
        }
        else {
          pVar18.second._0_1_ = bVar2;
          pVar18.first = (undefined1 *)((long)&(p->super_EpsCopyInputStream).limit_end_ + 2);
          pVar18._9_7_ = 0;
        }
        field_number = 0;
        if (pVar18.first == (char *)0x0) {
          bVar7 = false;
          local_108 = (ParseContext *)0x0;
        }
        else {
          this = (ExtensionSet *)ctx;
          pcVar10 = EpsCopyInputStream::ReadString
                              (&ctx->super_EpsCopyInputStream,pVar18.first,pVar18.second,&local_e0);
          pVar18._8_8_ = extraout_RDX;
          pVar18.first = pcVar10;
          bVar7 = pcVar10 != (char *)0x0;
          if (!bVar7) {
            local_108 = (ParseContext *)0x0;
          }
        }
        ptr = pVar18.first;
        bVar17 = false;
        if (bVar7) goto LAB_002b5b86;
      }
      else {
        this = (ExtensionSet *)local_f8;
        ptr = ParseField((ExtensionSet *)local_f8,(ulong)field_number * 8 + 2,ptr,local_e8,local_f0,
                         ctx);
        if ((ParseContext *)ptr != (ParseContext *)0x0) {
          field_number = 0;
          goto LAB_002b5b86;
        }
LAB_002b5a9a:
        bVar17 = false;
        local_108 = (ParseContext *)0x0;
      }
    }
    else if (cVar1 == '\x10') {
      uVar4 = *(ushort *)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_;
      uVar11 = (uint)(char)uVar4;
      uVar8 = uVar4 + uVar11;
      uVar14 = uVar11 * 2 & uVar8;
      pPVar16 = (ParseContext *)(ulong)(uVar14 >> 1);
      if ((short)uVar14 < 0) {
        puVar15 = (ushort *)((long)&(p->super_EpsCopyInputStream).limit_end_ + 3);
        lVar13 = 0xd;
        do {
          this = (ExtensionSet *)pPVar16;
          uVar11 = (uint)(char)*puVar15;
          uVar8 = *puVar15 + uVar11;
          uVar14 = uVar11 * 2 & uVar8;
          pPVar16 = (ParseContext *)
                    ((((ParseContext *)this)->super_EpsCopyInputStream).buffer_ +
                    ((ulong)uVar14 - 2 << ((byte)lVar13 & 0x3f)) + -0x28);
          if (-1 < (short)uVar14) {
            ptr = (char *)((long)puVar15 + (ulong)(uVar8 < uVar11) + 1);
            unaff_R12 = pPVar16;
            goto LAB_002b58b6;
          }
          lVar13 = lVar13 + 0xe;
          puVar15 = puVar15 + 1;
        } while (lVar13 != 0x45);
        ptr = (char *)0x0;
      }
      else {
        ptr = (p->super_EpsCopyInputStream).buffer_ + ((ulong)(uVar8 < uVar11) - 0x26);
        unaff_R12 = pPVar16;
      }
LAB_002b58b6:
      if ((ParseContext *)ptr == (ParseContext *)0x0) {
        bVar7 = false;
        local_108 = (ParseContext *)0x0;
      }
      else {
        field_number = (uint)unaff_R12;
        if ((char *)local_e0._M_string_length == (char *)0x0) {
          bVar7 = true;
        }
        else {
          local_a0.limit_end_ = (char *)&PTR__ExtensionFinder_0062fa70;
          local_a0.buffer_end_ = (char *)local_e8;
          extension_00 = &local_c0;
          bVar7 = FindExtensionInfoFromFieldNumber
                            (this,2,field_number,(ExtensionFinder *)&local_a0,extension_00,&local_f9
                            );
          sVar6 = local_e0._M_string_length;
          _Var5._M_p = local_e0._M_dataplus._M_p;
          if (bVar7) {
            if (local_c0.is_repeated == true) {
              this = (ExtensionSet *)
                     AddMessage((ExtensionSet *)local_f8,field_number,'\v',
                                (MessageLite *)local_c0.field_3.enum_validity_check.func,
                                local_c0.descriptor);
            }
            else {
              this = (ExtensionSet *)
                     MutableMessage((ExtensionSet *)local_f8,field_number,'\v',
                                    (MessageLite *)local_c0.field_3.enum_validity_check.func,
                                    local_c0.descriptor);
            }
            local_48 = ctx->depth_;
            local_a0.buffer_[0x18] = '\0';
            local_a0.buffer_[0x19] = '\0';
            local_a0.buffer_[0x1a] = '\0';
            local_a0.buffer_[0x1b] = '\0';
            local_a0.buffer_[0x1c] = '\0';
            local_a0.buffer_[0x1d] = '\0';
            local_a0.buffer_[0x1e] = '\0';
            local_a0.buffer_[0x1f] = '\0';
            local_a0.aliasing_ = 0;
            local_a0.buffer_[8] = '\0';
            local_a0.buffer_[9] = '\0';
            local_a0.buffer_[10] = '\0';
            local_a0.buffer_[0xb] = '\0';
            local_a0.buffer_[0xc] = '\0';
            local_a0.buffer_[0xd] = '\0';
            local_a0.buffer_[0xe] = '\0';
            local_a0.buffer_[0xf] = '\0';
            local_a0.buffer_[0x10] = '\0';
            local_a0.buffer_[0x11] = '\0';
            local_a0.buffer_[0x12] = '\0';
            local_a0.buffer_[0x13] = '\0';
            local_a0.buffer_[0x14] = '\0';
            local_a0.buffer_[0x15] = '\0';
            local_a0.buffer_[0x16] = '\0';
            local_a0.buffer_[0x17] = '\0';
            local_a0.zcis_ = (ZeroCopyInputStream *)0x0;
            local_a0.buffer_[0] = '\0';
            local_a0.buffer_[1] = '\0';
            local_a0.buffer_[2] = '\0';
            local_a0.buffer_[3] = '\0';
            local_a0.buffer_[4] = '\0';
            local_a0.buffer_[5] = '\0';
            local_a0.buffer_[6] = '\0';
            local_a0.buffer_[7] = '\0';
            local_a0.last_tag_minus_1_ = 0;
            local_a0.overall_limit_ = 0x7fffffff;
            local_44 = 0x80000000;
            local_40 = (DescriptorPool *)0x0;
            pMStack_38 = (MessageFactory *)0x0;
            flat.length_ = local_e0._M_string_length;
            flat.ptr_ = local_e0._M_dataplus._M_p;
            pcVar10 = EpsCopyInputStream::InitFrom(&local_a0,flat);
            local_40 = (ctx->data_).pool;
            pMStack_38 = (ctx->data_).factory;
            iVar9 = (*((Arena *)(((ParseContext *)this)->super_EpsCopyInputStream).limit_end_)->
                      on_arena_destruction_)(this,pcVar10,&local_a0);
            bVar17 = CONCAT44(extraout_var,iVar9) != 0;
            bVar7 = local_a0.last_tag_minus_1_ == 0 && bVar17;
            if (local_a0.last_tag_minus_1_ == 0 && bVar17) {
              field_number = 0;
            }
            else {
              local_108 = (ParseContext *)0x0;
            }
          }
          else {
            if ((*(ulong *)local_f0 & 1) == 0) {
              pbVar12 = InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                        ::mutable_unknown_fields_slow
                                  ((InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                                    *)local_f0);
            }
            else {
              pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (*(ulong *)local_f0 & 0xfffffffffffffffe);
            }
            this = (ExtensionSet *)((ulong)unaff_R12 & 0xffffffff);
            val.length_ = (stringpiece_ssize_type)pbVar12;
            val.ptr_ = (char *)sVar6;
            WriteLengthDelimited((internal *)this,(uint32)_Var5._M_p,val,(string *)extension_00);
            field_number = 0;
            bVar7 = true;
          }
        }
      }
      if (bVar7) {
LAB_002b5b86:
        bVar17 = true;
      }
      else {
        bVar17 = false;
      }
    }
    else {
      bVar2 = *(byte *)&(p->super_EpsCopyInputStream).limit_end_;
      uVar8 = (uint)bVar2;
      if ((char)bVar2 < '\0') {
        bVar3 = *(byte *)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_;
        uVar8 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
        if ((char)bVar3 < '\0') {
          pVar19 = ReadTagFallback((char *)p,uVar8);
          uVar8 = pVar19.second;
          ptr = pVar19.first;
          this = (ExtensionSet *)p;
        }
        else {
          ptr = (char *)((long)&(p->super_EpsCopyInputStream).limit_end_ + 2);
        }
      }
      if (uVar8 != 0 && (uVar8 & 7) != 4) {
        this = (ExtensionSet *)local_f8;
        ptr = ParseField((ExtensionSet *)local_f8,(ulong)uVar8,ptr,local_e8,local_f0,ctx);
        if ((ParseContext *)ptr == (ParseContext *)0x0) goto LAB_002b5a9a;
        goto LAB_002b5b86;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar8 - 1;
      bVar17 = false;
      local_108 = (ParseContext *)ptr;
    }
    p = local_108;
  } while (bVar17);
  local_108 = p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  return (char *)local_108;
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(const char* ptr,
                                                  const Msg* containing_type,
                                                  Metadata* metadata,
                                                  internal::ParseContext* ctx) {
  std::string payload;
  uint32 type_id = 0;
  while (!ctx->Done(&ptr)) {
    uint32 tag = static_cast<uint8>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64 tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      type_id = tmp;
      if (!payload.empty()) {
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, containing_type, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools.
          ParseContext tmp_ctx(ctx->depth(), false, &p, payload);
          tmp_ctx.data().pool = ctx->data().pool;
          tmp_ctx.data().factory = ctx->data().factory;
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        type_id = 0;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (type_id != 0) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64>(type_id) * 8 + 2, ptr,
                                    containing_type, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        type_id = 0;
      } else {
        int32 size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &payload);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, containing_type, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}